

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O2

void __thiscall TApp_EnumTest_Test::~TApp_EnumTest_Test(TApp_EnumTest_Test *this)

{
  TApp::~TApp(&this->super_TApp);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, EnumTest) {
    enum Level : std::int32_t { High, Medium, Low };
    Level level = Level::Low;
    app.add_option("--level", level);

    args = {"--level", "1"};
    run();
    EXPECT_EQ(level, Level::Medium);
}